

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

int Potassco::xconvert(char *x,uint *out,char **errPos,int param_4)

{
  bool bVar1;
  unsigned_long_long temp;
  unsigned_long_long local_20;
  char *local_18;
  
  local_20 = 0;
  local_18 = x;
  bVar1 = parseUnsigned(&local_18,&local_20,0xffffffff);
  if (bVar1) {
    *out = (uint)local_20;
  }
  if (errPos != (char **)0x0) {
    *errPos = local_18;
  }
  return (uint)bVar1;
}

Assistant:

int xconvert(const char* x, unsigned& out, const char** errPos, int) {
	unsigned long long temp = 0;
	if (parseUnsigned(x, temp, UINT_MAX)) {
		out = static_cast<unsigned>(temp);
		return parsed(1, x, errPos);
	}
	return parsed(0, x, errPos);
}